

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_audio.h
# Opt level: O2

void saudio_shutdown(void)

{
  if (_saudio.valid) {
    _saudio_backend_shutdown();
    if (_saudio.fifo.base_ptr == (uint8_t *)0x0) {
      __assert_fail("fifo->base_ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_audio.h"
                    ,0x3fe,"void _saudio_fifo_shutdown(_saudio_fifo_t *)");
    }
    free(_saudio.fifo.base_ptr);
    _saudio.fifo.base_ptr = (uint8_t *)0x0;
    _saudio.fifo.valid = false;
    pthread_mutex_destroy((pthread_mutex_t *)&_saudio.fifo.mutex);
    _saudio.valid = false;
  }
  return;
}

Assistant:

SOKOL_API_IMPL void saudio_shutdown(void) {
    if (_saudio.valid) {
        _saudio_backend_shutdown();
        _saudio_fifo_shutdown(&_saudio.fifo);
        _saudio.valid = false;
    }
}